

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O0

void __thiscall ParameterReader::setVal(ParameterReader *this,string *name,double value)

{
  size_type sVar1;
  reference this_00;
  reference pvVar2;
  string *in_RSI;
  string *in_RDI;
  value_type in_XMM0_Qa;
  long idx;
  value_type *in_stack_fffffffffffffea8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffeb8;
  string *str;
  string local_110 [32];
  string local_f0 [8];
  string *in_stack_ffffffffffffff18;
  string local_d0 [32];
  string *in_stack_ffffffffffffff50;
  ParameterReader *in_stack_ffffffffffffff58;
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  size_type local_20;
  value_type local_18;
  
  local_18 = in_XMM0_Qa;
  std::__cxx11::string::string(local_40,in_RSI);
  sVar1 = _find(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_40);
  local_20 = sVar1;
  if (sVar1 == 0xffffffffffffffff) {
    str = in_RDI;
    std::__cxx11::string::string((string *)&stack0xffffffffffffff50,in_RSI);
    AfterburnerUtil::trim(in_stack_ffffffffffffff18);
    AfterburnerUtil::toLower(str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_RDI,in_stack_fffffffffffffeb8);
  }
  else {
    std::__cxx11::string::string(local_110,in_RSI);
    AfterburnerUtil::trim(in_stack_ffffffffffffff18);
    AfterburnerUtil::toLower(in_RDI);
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_RDI,local_20);
    std::__cxx11::string::operator=((string *)this_00,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_110);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)&in_RDI->field_2 + 8),
                        local_20);
    *pvVar2 = local_18;
  }
  return;
}

Assistant:

void ParameterReader::setVal(string name, double value) {
    /*
      Set the parameter with "name" to "value". It is appended to the
      internal "names" and "values" vector if "name" does not exist;
      otherwise it is rewitten.
    */
    long idx = _find(name);
    if (idx == -1) {
        names.push_back(toLower(trim(name)));
        values.push_back(value);
    } else {
        names[idx] = toLower(trim(name));
        values[idx] = value;
    }
}